

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

float ImGuiStb::STB_TEXTEDIT_GETWIDTH(ImGuiTextEditState *obj,int line_start_idx,int char_idx)

{
  value_type_conflict *pvVar1;
  float fVar2;
  ImWchar c;
  int char_idx_local;
  int line_start_idx_local;
  ImGuiTextEditState *obj_local;
  
  pvVar1 = ImVector<unsigned_short>::operator[](&obj->Text,line_start_idx + char_idx);
  if (*pvVar1 == 10) {
    obj_local._4_4_ = -1.0;
  }
  else {
    fVar2 = ImFont::GetCharAdvance(GImGui->Font,*pvVar1);
    obj_local._4_4_ = fVar2 * (GImGui->FontSize / GImGui->Font->FontSize);
  }
  return obj_local._4_4_;
}

Assistant:

static float   STB_TEXTEDIT_GETWIDTH(STB_TEXTEDIT_STRING* obj, int line_start_idx, int char_idx)  { ImWchar c = obj->Text[line_start_idx+char_idx]; if (c == '\n') return STB_TEXTEDIT_GETWIDTH_NEWLINE; return GImGui->Font->GetCharAdvance(c) * (GImGui->FontSize / GImGui->Font->FontSize); }